

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

ObjectComprehensionSimple * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::ObjectComprehensionSimple,jsonnet::internal::LocationRange&,jsonnet::internal::Index*,jsonnet::internal::Local*,jsonnet::internal::Identifier_const*&,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,Index **args_1,Local **args_2,Identifier **args_3,
          AST **args_4)

{
  ObjectComprehensionSimple *this_00;
  Identifier *in_RCX;
  AST *in_RDX;
  AST *in_RSI;
  LocationRange *in_RDI;
  AST *in_R8;
  ObjectComprehensionSimple *unaff_retaddr;
  ObjectComprehensionSimple *r;
  
  this_00 = (ObjectComprehensionSimple *)operator_new(0xa0);
  ObjectComprehensionSimple::ObjectComprehensionSimple
            (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }